

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NPTf.hpp
# Opt level: O0

void __thiscall OpenMD::NPTf::NPTf(NPTf *this,SimInfo *info)

{
  undefined8 *in_RDI;
  SimInfo *in_stack_00000108;
  NPT *in_stack_00000110;
  
  NPT::NPT(in_stack_00000110,in_stack_00000108);
  *in_RDI = &PTR__NPTf_004fe718;
  SquareMatrix3<double>::SquareMatrix3((SquareMatrix3<double> *)0x2365b6);
  SquareMatrix3<double>::SquareMatrix3((SquareMatrix3<double> *)0x2365ce);
  SquareMatrix3<double>::SquareMatrix3((SquareMatrix3<double> *)0x2365e6);
  SquareMatrix3<double>::SquareMatrix3((SquareMatrix3<double> *)0x2365f9);
  return;
}

Assistant:

NPTf(SimInfo* info) : NPT(info) {}